

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  bool bVar1;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  string source_name;
  string destination_dir;
  undefined1 local_48 [8];
  string real_destination;
  bool perms;
  mode_t perm;
  string *destination_local;
  string *source_local;
  
  bVar1 = SameFile(source,destination);
  if (bVar1) {
    source_local._7_1_ = 1;
    goto LAB_0058a8ce;
  }
  real_destination.field_2._12_4_ = 0;
  real_destination.field_2._M_local_buf[0xb] =
       GetPermissions(source,(mode_t *)(real_destination.field_2._M_local_buf + 0xc));
  std::__cxx11::string::string((string *)local_48,(string *)destination);
  bVar1 = FileIsDirectory(source);
  if (bVar1) {
    MakeDirectory(destination,(mode_t *)0x0);
LAB_0058a870:
    if (((real_destination.field_2._M_local_buf[0xb] & 1U) == 0) ||
       (bVar1 = SetPermissions((string *)local_48,real_destination.field_2._12_4_,false), bVar1)) {
      source_local._7_1_ = 1;
    }
    else {
      source_local._7_1_ = 0;
    }
  }
  else {
    std::__cxx11::string::string((string *)(source_name.field_2._M_local_buf + 8));
    bVar1 = FileIsDirectory(destination);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(source_name.field_2._M_local_buf + 8),(string *)local_48);
      ConvertToUnixSlashes((string *)local_48);
      std::__cxx11::string::operator+=((string *)local_48,'/');
      std::__cxx11::string::string((string *)local_98,(string *)source);
      GetFilenameName(&local_b8,(string *)local_98);
      std::__cxx11::string::operator+=((string *)local_48,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)local_98);
    }
    else {
      GetFilenamePath(&local_d8,destination);
      std::__cxx11::string::operator=
                ((string *)(source_name.field_2._M_local_buf + 8),(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    MakeDirectory((string *)((long)&source_name.field_2 + 8),(mode_t *)0x0);
    bVar1 = CloneFileContent(source,(string *)local_48);
    if ((bVar1) || (bVar1 = CopyFileContentBlockwise(source,(string *)local_48), bVar1)) {
      bVar1 = false;
    }
    else {
      source_local._7_1_ = 0;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)(source_name.field_2._M_local_buf + 8));
    if (!bVar1) goto LAB_0058a870;
  }
  std::__cxx11::string::~string((string *)local_48);
LAB_0058a8ce:
  return (bool)(source_local._7_1_ & 1);
}

Assistant:

bool SystemTools::CopyFileAlways(const std::string& source,
                                 const std::string& destination)
{
  // If files are the same do not copy
  if (SystemTools::SameFile(source, destination)) {
    return true;
  }
  mode_t perm = 0;
  bool perms = SystemTools::GetPermissions(source, perm);
  std::string real_destination = destination;

  if (SystemTools::FileIsDirectory(source)) {
    SystemTools::MakeDirectory(destination);
  } else {
    // If destination is a directory, try to create a file with the same
    // name as the source in that directory.

    std::string destination_dir;
    if (SystemTools::FileIsDirectory(destination)) {
      destination_dir = real_destination;
      SystemTools::ConvertToUnixSlashes(real_destination);
      real_destination += '/';
      std::string source_name = source;
      real_destination += SystemTools::GetFilenameName(source_name);
    } else {
      destination_dir = SystemTools::GetFilenamePath(destination);
    }

    // Create destination directory

    SystemTools::MakeDirectory(destination_dir);

    if (!CloneFileContent(source, real_destination)) {
      // if cloning did not succeed, fall back to blockwise copy
      if (!CopyFileContentBlockwise(source, real_destination)) {
        return false;
      }
    }
  }
  if (perms) {
    if (!SystemTools::SetPermissions(real_destination, perm)) {
      return false;
    }
  }
  return true;
}